

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O1

void __thiscall
testing::internal::
CartesianProductGenerator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int),_BLOCK_SIZE>
::IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_>::Advance
          (IteratorImpl<testing::internal::IndexSequence<0UL,_1UL>_> *this)

{
  (**(code **)(*(long *)(this->current_).
                        super__Tuple_impl<0UL,_testing::internal::ParamIterator<void_(*)(unsigned_char_*,_const_unsigned_char_*,_int,_int,_const_unsigned_char_*,_int)>,_testing::internal::ParamIterator<BLOCK_SIZE>_>
                        .super__Tuple_impl<1UL,_testing::internal::ParamIterator<BLOCK_SIZE>_>.
                        super__Head_base<1UL,_testing::internal::ParamIterator<BLOCK_SIZE>,_false>.
                        _M_head_impl.impl_._M_t.
                        super___uniq_ptr_impl<testing::internal::ParamIteratorInterface<BLOCK_SIZE>,_std::default_delete<testing::internal::ParamIteratorInterface<BLOCK_SIZE>_>_>
              + 0x18))();
  CartesianProductGenerator<void(*)(unsigned_char*,unsigned_char_const*,int,int,unsigned_char_const*,int),BLOCK_SIZE>
  ::IteratorImpl<testing::internal::IndexSequence<0ul,1ul>>::AdvanceIfEnd<1ul>
            ((IteratorImpl<testing::internal::IndexSequence<0ul,1ul>> *)this);
  ComputeCurrentValue(this);
  return;
}

Assistant:

void Advance() override {
      assert(!AtEnd());
      // Advance the last iterator.
      ++std::get<sizeof...(T) - 1>(current_);
      // if that reaches end, propagate that up.
      AdvanceIfEnd<sizeof...(T) - 1>();
      ComputeCurrentValue();
    }